

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O2

size_t bign96Sign2_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  sVar3 = beltWBL_keep();
  sVar4 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar5 = zzMul_deep(2,n);
  sVar6 = zzMod_deep(n + 2,n);
  sVar2 = utilMax(6,sVar2,0x20,sVar3,sVar4,sVar5,sVar6);
  return sVar2 + sVar1 + n * 0x18 + 0x20;
}

Assistant:

static size_t bign96Sign2_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(3 * n + 2 * W_OF_O(13)) +
		beltHash_keep() +
		utilMax(6,
			beltHash_keep(),
			32,
			beltKWP_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(W_OF_O(13), n),
			zzMod_deep(n + W_OF_O(13), n));
}